

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
iu_FilePath_x_iutest_x_DirectoryExists_Test::iu_FilePath_x_iutest_x_DirectoryExists_Test
          (iu_FilePath_x_iutest_x_DirectoryExists_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0038e080;
  return;
}

Assistant:

IUTEST(FilePath, DirectoryExists)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_FALSE(path.DirectoryExists());
    }
#if defined(IUTEST_USE_GTEST) || IUTEST_HAS_FILE_STAT
    {
        ::iutest::internal::FilePath path = ::iutest::internal::FilePath::GetCurrentDir();
        IUTEST_EXPECT_FALSE(path.IsEmpty());
        IUTEST_EXPECT_TRUE (path.DirectoryExists());
    }
#endif
}